

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O0

int regex_compile(regex_handle *re,char *pattern)

{
  long lVar1;
  undefined1 local_38 [4];
  int ret;
  size_t erroroffset;
  long *plStack_28;
  int errorcode;
  regex_priv *priv;
  char *pattern_local;
  regex_handle *re_local;
  
  plStack_28 = (long *)re->priv;
  priv = (regex_priv *)pattern;
  pattern_local = (char *)re;
  if (*plStack_28 != 0) {
    pcre2_code_free_8(*plStack_28);
  }
  lVar1 = pcre2_compile_8(priv,0xffffffffffffffff,0,(long)&erroroffset + 4,local_38,0);
  *plStack_28 = lVar1;
  if (*plStack_28 == 0) {
    if (*plStack_28 != 0) {
      pcre2_code_free_8(*plStack_28);
      *plStack_28 = 0;
    }
    re_local._4_4_ = -0x16;
  }
  else {
    re_local._4_4_ = 0;
  }
  return re_local._4_4_;
}

Assistant:

int regex_compile(struct regex_handle *re, const char *pattern)
{
	struct regex_priv *priv = re->priv;
	int errorcode;
	PCRE2_SIZE erroroffset;
	int ret;

	if (priv->re != NULL)
		pcre2_code_free(priv->re);

	priv->re = pcre2_compile((PCRE2_SPTR)pattern, PCRE2_ZERO_TERMINATED, 0,
				 &errorcode, &erroroffset, NULL);
	if (priv->re == NULL) {
		ret = -EINVAL;
		goto regex_compile_exit;
	}

	return 0;

regex_compile_exit:
	if (priv->re != NULL) {
		pcre2_code_free(priv->re);
		priv->re = NULL;
	}

	return ret;
}